

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_and_32_re_al(void)

{
  uint uVar1;
  uint address;
  uint uVar2;
  uint res;
  uint ea;
  
  address = m68ki_read_imm_32();
  uVar1 = m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7];
  uVar2 = m68ki_read_32_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_cpu.not_z_flag = uVar1 & uVar2;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  m68ki_write_32_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_and_32_re_al(void)
{
	uint ea = EA_AL_32();
	uint res = DX & m68ki_read_32(ea);

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;

	m68ki_write_32(ea, res);
}